

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_lower_bound(OSQPWorkspace *work,c_float *l_new)

{
  double *pdVar1;
  double dVar2;
  c_float *in_RSI;
  OSQPWorkspace *in_RDI;
  c_float cVar3;
  c_int exitflag;
  c_int i;
  undefined8 in_stack_ffffffffffffffe0;
  OSQPTimer *t;
  c_int local_8;
  
  if (in_RDI == (OSQPWorkspace *)0x0) {
    local_8 = _osqp_error((osqp_error_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(char *)0x0);
  }
  else {
    if (in_RDI->clear_update_time == 1) {
      in_RDI->clear_update_time = 0;
      in_RDI->info->update_time = 0.0;
    }
    osqp_tic((OSQPTimer *)0x10bb2d);
    prea_vec_copy(in_RSI,in_RDI->data->l,in_RDI->data->m);
    if (in_RDI->settings->scaling != 0) {
      vec_ew_prod(in_RDI->scaling->E,in_RDI->data->l,in_RDI->data->l,in_RDI->data->m);
    }
    for (t = (OSQPTimer *)0x0; (long)t < in_RDI->data->m;
        t = (OSQPTimer *)((long)&(t->tic).tv_sec + 1)) {
      dVar2 = in_RDI->data->l[(long)t];
      pdVar1 = in_RDI->data->u + (long)t;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        printf("ERROR in %s: ","osqp_update_lower_bound");
        printf("upper bound must be greater than or equal to lower bound");
        printf("\n");
        return 1;
      }
    }
    reset_info((OSQPInfo *)0x10bc47);
    local_8 = update_rho_vec(in_RDI);
    cVar3 = osqp_toc(t);
    in_RDI->info->update_time = cVar3 + in_RDI->info->update_time;
  }
  return local_8;
}

Assistant:

c_int osqp_update_lower_bound(OSQPWorkspace *work, const c_float *l_new) {
  c_int i, exitflag = 0;

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Replace l by the new vector
  prea_vec_copy(l_new, work->data->l, work->data->m);

  // Scaling
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->E, work->data->l, work->data->l, work->data->m);
  }

  // Check if lower bound is smaller than upper bound
  for (i = 0; i < work->data->m; i++) {
    if (work->data->l[i] > work->data->u[i]) {
#ifdef PRINTING
      c_eprint("upper bound must be greater than or equal to lower bound");
#endif /* ifdef PRINTING */
      return 1;
    }
  }

  // Reset solver information
  reset_info(work->info);

#if EMBEDDED != 1
  // Update rho_vec and refactor if constraints type changes
  exitflag = update_rho_vec(work);
#endif // EMBEDDED ! =1

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}